

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateMIPSAssembly.cpp
# Opt level: O1

string * getValueOfVarIml(string *__return_storage_ptr__,function *fn,string *varName,
                         string *varName1,Identifier *var,varType type)

{
  pointer pcVar1;
  string *psVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  char cVar6;
  identifierCategory iVar7;
  varType vVar8;
  Reg RVar9;
  varType vVar10;
  tokenCategory tVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int *piVar17;
  long lVar18;
  undefined8 *puVar19;
  const_iterator cVar20;
  long *plVar21;
  mapped_type *pmVar22;
  mapped_type *pmVar23;
  bool *pbVar24;
  uint uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  size_type *psVar28;
  size_type *psVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  undefined8 uVar33;
  _Alloc_hider _Var34;
  char *pcVar35;
  size_type sVar36;
  size_type sVar37;
  string name0_1;
  string vn_3;
  string name0;
  string realName2;
  string realName;
  stringstream stream2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  stringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  Identifier *local_3d8;
  varType local_3cc;
  function *local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string *local_3a0;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  uint auStack_370 [22];
  ios_base local_318 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  long local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3cc = type;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar16 = std::__cxx11::string::find((char)varName,0x5b);
  if (lVar16 == -1) {
    if ((var->initialized == true) && (iVar7 = Identifier::getIdCategory(var), iVar7 == CONST)) {
      tVar11 = tokenType::getTokenCategory(&var->super_tokenType);
      if (tVar11 != CHARTK) {
        iVar15 = Identifier::getIntValue(var,0);
        std::ostream::operator<<(local_1a8,iVar15);
        std::__cxx11::stringbuf::str();
        goto LAB_0013c7b6;
      }
      cVar6 = Identifier::getCharValue(var,0);
      local_398[0] = cVar6;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_398,1);
      std::__cxx11::stringbuf::str();
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_458,0,(char *)0x0,0x14551c);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 == paVar26) {
        local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_388._8_8_ = puVar19[3];
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_398 + 0x10);
      }
      else {
        local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar19;
      }
      local_398._8_8_ = puVar19[1];
      *puVar19 = paVar26;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      plVar21 = (long *)std::__cxx11::string::append(local_398);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar29 = (size_type *)(plVar21 + 2);
      if ((size_type *)*plVar21 == psVar29) {
        lVar16 = plVar21[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar29;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar16;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar21;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar29;
      }
      __return_storage_ptr__->_M_string_length = plVar21[1];
      *plVar21 = (long)psVar29;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_398 + 0x10)) {
        operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
      }
    }
    else {
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      pcVar1 = (varName1->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,pcVar1,pcVar1 + varName1->_M_string_length);
      _Var34._M_p = local_458._M_dataplus._M_p;
      if (local_458._M_string_length != 0) {
        sVar36 = 0;
        do {
          iVar15 = tolower((int)_Var34._M_p[sVar36]);
          _Var34._M_p[sVar36] = (char)iVar15;
          sVar36 = sVar36 + 1;
        } while (local_458._M_string_length != sVar36);
      }
      bVar5 = function::varHasReg(fn,varName1);
      if (bVar5) {
        local_398._0_4_ = function::getRegOfVar(fn,varName1,true);
        pmVar23 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (pmVar23->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
      }
      else {
        bVar5 = function::stackHasVar(fn,varName1);
        if (!bVar5) {
          cVar20 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&var2mem_abi_cxx11_._M_t,&local_458);
          if ((_Rb_tree_header *)cVar20._M_node ==
              &var2mem_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            vVar8 = whatIsThisShit(varName1,fn);
            variableArrangeSpace(fn,varName1,vVar8);
            bVar5 = function::varHasReg(fn,varName1);
            if (bVar5) {
              local_398._0_4_ = function::getRegOfVar(fn,varName1,false);
              pmVar23 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar1 = (pmVar23->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length)
              ;
            }
            else {
              iVar15 = function::getOffSet(fn,varName1);
              std::__cxx11::to_string(&local_498,iVar15);
              std::operator+(&local_3f8,"lw $t9 ",&local_498);
              plVar21 = (long *)std::__cxx11::string::append((char *)&local_3f8);
              psVar29 = (size_type *)(plVar21 + 2);
              if ((size_type *)*plVar21 == psVar29) {
                local_388._M_allocated_capacity = *psVar29;
                local_388._8_8_ = plVar21[3];
                local_398._0_8_ = local_398 + 0x10;
              }
              else {
                local_388._M_allocated_capacity = *psVar29;
                local_398._0_8_ = (size_type *)*plVar21;
              }
              local_398._8_8_ = plVar21[1];
              *plVar21 = (long)psVar29;
              plVar21[1] = 0;
              *(undefined1 *)(plVar21 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398);
              if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              local_398._0_4_ = 0x19;
              pmVar23 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar1 = (pmVar23->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length)
              ;
            }
            goto LAB_0013ab79;
          }
        }
        bVar5 = function::stackHasVar(fn,varName1);
        if (bVar5) {
          uVar14 = function::getOffSet(fn,varName1);
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013a9d8;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013a9d8;
              }
              if (uVar25 < 10000) goto LAB_0013a9d8;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013a9d8:
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_498,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_498._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,0x1459d9);
          psVar29 = (size_type *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar29) {
            local_3f8.field_2._M_allocated_capacity = *psVar29;
            local_3f8.field_2._8_8_ = plVar21[3];
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          }
          else {
            local_3f8.field_2._M_allocated_capacity = *psVar29;
            local_3f8._M_dataplus._M_p = (pointer)*plVar21;
          }
          local_3f8._M_string_length = plVar21[1];
          *plVar21 = (long)psVar29;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_388._8_8_ = puVar19[3];
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_398 + 0x10);
          }
          else {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar19;
          }
          local_398._8_8_ = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_398 + 0x10)) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_398);
          pcVar1 = (varName->_M_dataplus)._M_p;
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3f8,pcVar1,pcVar1 + varName->_M_string_length);
          sVar36 = local_3f8._M_string_length;
          _Var34._M_p = local_3f8._M_dataplus._M_p;
          if (local_3f8._M_string_length != 0) {
            sVar37 = 0;
            do {
              iVar15 = tolower((int)_Var34._M_p[sVar37]);
              _Var34._M_p[sVar37] = (char)iVar15;
              sVar37 = sVar37 + 1;
            } while (sVar36 != sVar37);
          }
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(&var2mem_abi_cxx11_,&local_3f8);
          iVar15 = *pmVar22;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2);
          *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15);
          std::__cxx11::stringbuf::str();
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x1459d9);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_498.field_2._8_8_ = puVar19[3];
            local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          }
          else {
            local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_498._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_498._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
          std::ios_base::~ios_base(local_318);
        }
        local_398._0_4_ = 0x19;
        pmVar23 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (pmVar23->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
      }
    }
LAB_0013ab79:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0013c7b6;
  }
  pcVar1 = (varName->_M_dataplus)._M_p;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,pcVar1 + varName->_M_string_length);
  boomVec(&local_210,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((long)local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    if ((local_210.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
      pcVar35 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
      uVar30 = 0;
LAB_0013cd68:
      uVar33 = 0;
LAB_0013cd71:
      std::__throw_out_of_range_fmt(pcVar35,uVar33,uVar30);
    }
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    if ((int)paVar26->_M_local_buf[0] - 0x30U < 10) {
      local_3c8 = fn;
      piVar17 = __errno_location();
      iVar15 = *piVar17;
      *piVar17 = 0;
      lVar16 = strtol(paVar26->_M_local_buf,(char **)local_398,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ == paVar26) {
        std::__throw_invalid_argument("stoi");
      }
      else {
        uVar32 = (uint)lVar16;
        if (((int)uVar32 == lVar16) && (*piVar17 != 0x22)) {
          if (*piVar17 == 0) {
            *piVar17 = iVar15;
          }
          uVar14 = -uVar32;
          if (0 < (int)uVar32) {
            uVar14 = uVar32;
          }
          uVar31 = 1;
          if (9 < uVar14) {
            uVar30 = (ulong)uVar14;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00139697;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00139697;
              }
              if (uVar25 < 10000) goto LAB_00139697;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_00139697:
          paVar26 = &local_458.field_2;
          local_458._M_dataplus._M_p = (pointer)paVar26;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_458,(char)uVar31 - ((char)((ulong)lVar16 >> 0x18) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_458._M_dataplus._M_p + (uVar32 >> 0x1f),uVar31,uVar14);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_458,0,(char *)0x0,0x145946);
          psVar29 = (size_type *)(local_398 + 0x10);
          psVar28 = (size_type *)(plVar21 + 2);
          if ((size_type *)*plVar21 == psVar28) {
            local_388._M_allocated_capacity = *psVar28;
            local_388._8_8_ = plVar21[3];
            local_398._0_8_ = psVar29;
          }
          else {
            local_388._M_allocated_capacity = *psVar28;
            local_398._0_8_ = (size_type *)*plVar21;
          }
          local_398._8_8_ = plVar21[1];
          *plVar21 = (long)psVar28;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((size_type *)local_398._0_8_ != psVar29) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != paVar26) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[14]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
          if (local_3cc == LOCAL_VAR) {
            uVar14 = function::getOffSet(local_3c8,varName1);
            uVar32 = -uVar14;
            if (0 < (int)uVar14) {
              uVar32 = uVar14;
            }
            uVar31 = 1;
            if (9 < uVar32) {
              uVar30 = (ulong)uVar32;
              uVar4 = 4;
              do {
                uVar31 = uVar4;
                uVar25 = (uint)uVar30;
                if (uVar25 < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_00139e56;
                }
                if (uVar25 < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_00139e56;
                }
                if (uVar25 < 10000) goto LAB_00139e56;
                uVar30 = uVar30 / 10000;
                uVar4 = uVar31 + 4;
              } while (99999 < uVar25);
              uVar31 = uVar31 + 1;
            }
LAB_00139e56:
            local_458._M_dataplus._M_p = (pointer)paVar26;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_458,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_458._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
            plVar21 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_458,0,(char *)0x0,0x14595c);
            psVar28 = (size_type *)(plVar21 + 2);
            if ((size_type *)*plVar21 == psVar28) {
              local_388._M_allocated_capacity = *psVar28;
              local_388._8_8_ = plVar21[3];
              local_398._0_8_ = psVar29;
            }
            else {
              local_388._M_allocated_capacity = *psVar28;
              local_398._0_8_ = (size_type *)*plVar21;
            }
            local_398._8_8_ = plVar21[1];
            *plVar21 = (long)psVar28;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398);
            if ((size_type *)local_398._0_8_ != psVar29) {
              operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != paVar26) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[16]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_398);
            pcVar1 = (varName1->_M_dataplus)._M_p;
            local_458._M_dataplus._M_p = (pointer)paVar26;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_458,pcVar1,pcVar1 + varName1->_M_string_length);
            _Var34._M_p = local_458._M_dataplus._M_p;
            if (local_458._M_string_length != 0) {
              sVar36 = 0;
              do {
                iVar15 = tolower((int)_Var34._M_p[sVar36]);
                _Var34._M_p[sVar36] = (char)iVar15;
                sVar36 = sVar36 + 1;
              } while (local_458._M_string_length != sVar36);
            }
            pmVar22 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::at(&var2mem_abi_cxx11_,&local_458);
            iVar15 = *pmVar22;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2)
            ;
            *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
                 *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
                 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15);
            std::__cxx11::stringbuf::str();
            plVar21 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_498,0,(char *)0x0,0x14595c);
            psVar29 = (size_type *)(plVar21 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar21 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar29) {
              local_3f8.field_2._M_allocated_capacity = *psVar29;
              local_3f8.field_2._8_8_ = plVar21[3];
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            }
            else {
              local_3f8.field_2._M_allocated_capacity = *psVar29;
              local_3f8._M_dataplus._M_p = (pointer)*plVar21;
            }
            local_3f8._M_string_length = plVar21[1];
            *plVar21 = (long)psVar29;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_3f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != paVar26) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
            std::ios_base::~ios_base(local_318);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
          local_398._0_4_ = 0x19;
          pmVar23 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar1 = (pmVar23->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
          goto LAB_0013c7a9;
        }
      }
      std::__throw_out_of_range("stoi");
LAB_0013cd90:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    pcVar1 = ((local_210.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,pcVar1,
               pcVar1 + (local_210.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    getRealName(&local_3f8,&local_458,'[');
    vVar8 = whatIsThisShit(&local_3f8,fn);
    if (vVar8 == TEMP_VAR) {
      bVar5 = function::varHasReg(fn,&local_458);
      if (bVar5) {
        local_438._M_dataplus._M_p._0_4_ = function::getRegOfVar(fn,&local_458,true);
        pmVar23 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_438);
        std::operator+(&local_498,"sll $t8 ",pmVar23);
        puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_388._8_8_ = puVar19[3];
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_398 + 0x10);
        }
        else {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar19;
        }
        local_398._8_8_ = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) {
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
        uVar33 = local_498.field_2._M_allocated_capacity;
        _Var34._M_p = local_498._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
LAB_0013b06f:
          operator_delete(_Var34._M_p,uVar33 + 1);
        }
      }
      else {
        uVar31 = 1;
        uVar14 = function::getOffsetOfTemp(fn,&local_458,true);
        uVar32 = -uVar14;
        if (0 < (int)uVar14) {
          uVar32 = uVar14;
        }
        uVar30 = (ulong)uVar32;
        if (9 < uVar32) {
          uVar4 = 4;
          do {
            uVar31 = uVar4;
            uVar25 = (uint)uVar30;
            if (uVar25 < 100) {
              uVar31 = uVar31 - 2;
              goto LAB_0013adf4;
            }
            if (uVar25 < 1000) {
              uVar31 = uVar31 - 1;
              goto LAB_0013adf4;
            }
            if (uVar25 < 10000) goto LAB_0013adf4;
            uVar30 = uVar30 / 10000;
            uVar4 = uVar31 + 4;
          } while (99999 < uVar25);
          uVar31 = uVar31 + 1;
        }
LAB_0013adf4:
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_438,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_438._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x14599f);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_498.field_2._8_8_ = puVar19[3];
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        }
        else {
          local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_498._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_498._M_string_length = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_388._8_8_ = puVar19[3];
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_398 + 0x10);
        }
        else {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar19;
        }
        local_398._8_8_ = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) {
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
      }
    }
    else {
      getValueOfVar((string *)local_398,&local_458,fn);
      vVar8 = whatIsThisShit((string *)local_398,fn);
      uVar33 = local_398._0_8_;
      if (vVar8 != TEMP_VAR) {
        local_3c8 = fn;
        piVar17 = __errno_location();
        iVar15 = *piVar17;
        *piVar17 = 0;
        lVar16 = strtol((char *)uVar33,(char **)&local_478,10);
        if (local_478._M_dataplus._M_p == (pointer)uVar33) {
LAB_0013ce10:
          std::__throw_invalid_argument("stoi");
        }
        else {
          iVar12 = (int)lVar16;
          if ((iVar12 == lVar16) && (*piVar17 != 0x22)) {
            if (*piVar17 == 0) {
              *piVar17 = iVar15;
            }
            uVar14 = iVar12 * 4;
            uVar32 = iVar12 * -4;
            if (iVar12 * -4 < 0) {
              uVar32 = uVar14;
            }
            uVar31 = 1;
            if (9 < uVar32) {
              uVar30 = (ulong)uVar32;
              uVar4 = 4;
              do {
                uVar31 = uVar4;
                uVar25 = (uint)uVar30;
                if (uVar25 < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_0013af70;
                }
                if (uVar25 < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_0013af70;
                }
                if (uVar25 < 10000) goto LAB_0013af70;
                uVar30 = uVar30 / 10000;
                uVar4 = uVar31 + 4;
              } while (99999 < uVar25);
              uVar31 = uVar31 + 1;
            }
LAB_0013af70:
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_438,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_438._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x145946);
            fn = local_3c8;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar19 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar19 == paVar26) {
              local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_498.field_2._8_8_ = puVar19[3];
              local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
            }
            else {
              local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
              local_498._M_dataplus._M_p = (pointer)*puVar19;
            }
            local_498._M_string_length = puVar19[1];
            *puVar19 = paVar26;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_0013b056;
          }
        }
        std::__throw_out_of_range("stoi");
LAB_0013ce28:
        std::__throw_invalid_argument("stoi");
LAB_0013ce34:
        std::__throw_out_of_range("stoi");
LAB_0013ce40:
        std::__throw_invalid_argument("stoi");
LAB_0013ce4c:
        std::__throw_out_of_range("stoi");
LAB_0013ce58:
        std::__throw_invalid_argument("stoi");
LAB_0013ce64:
        std::__throw_out_of_range("stoi");
LAB_0013ce70:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      std::operator+(&local_438,"sll $t8 ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
      ;
      puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_438);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 == paVar26) {
        local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_498.field_2._8_8_ = puVar19[3];
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      }
      else {
        local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_498._M_dataplus._M_p = (pointer)*puVar19;
      }
      local_498._M_string_length = puVar19[1];
      *puVar19 = paVar26;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,&local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
LAB_0013b056:
      uVar33 = local_388._M_allocated_capacity;
      _Var34._M_p = (pointer)local_398._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_398 + 0x10)) goto LAB_0013b06f;
    }
    if (local_3cc == LOCAL_VAR) {
      uVar14 = function::getOffSet(fn,varName1);
      uVar32 = -uVar14;
      if (0 < (int)uVar14) {
        uVar32 = uVar14;
      }
      uVar31 = 1;
      if (9 < uVar32) {
        uVar30 = (ulong)uVar32;
        uVar4 = 4;
        do {
          uVar31 = uVar4;
          uVar25 = (uint)uVar30;
          if (uVar25 < 100) {
            uVar31 = uVar31 - 2;
            goto LAB_0013b2b0;
          }
          if (uVar25 < 1000) {
            uVar31 = uVar31 - 1;
            goto LAB_0013b2b0;
          }
          if (uVar25 < 10000) goto LAB_0013b2b0;
          uVar30 = uVar30 / 10000;
          uVar4 = uVar31 + 4;
        } while (99999 < uVar25);
        uVar31 = uVar31 + 1;
      }
LAB_0013b2b0:
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_498,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_498._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,0x14595c);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 == paVar26) {
        local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_388._8_8_ = puVar19[3];
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_398 + 0x10);
      }
      else {
        local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar19;
      }
      local_398._8_8_ = puVar19[1];
      *puVar19 = paVar26;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_398 + 0x10)) {
        operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_398);
      pcVar1 = (varName1->_M_dataplus)._M_p;
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_498,pcVar1,pcVar1 + varName1->_M_string_length);
      sVar36 = local_498._M_string_length;
      _Var34._M_p = local_498._M_dataplus._M_p;
      if (local_498._M_string_length != 0) {
        sVar37 = 0;
        do {
          iVar15 = tolower((int)_Var34._M_p[sVar37]);
          _Var34._M_p[sVar37] = (char)iVar15;
          sVar37 = sVar37 + 1;
        } while (sVar36 != sVar37);
      }
      pmVar22 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::at(&var2mem_abi_cxx11_,&local_498);
      iVar15 = *pmVar22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2);
      *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
           0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15);
      std::__cxx11::stringbuf::str();
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x14595c);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 == paVar26) {
        local_438.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_438.field_2._8_8_ = puVar19[3];
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      }
      else {
        local_438.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_438._M_dataplus._M_p = (pointer)*puVar19;
      }
      local_438._M_string_length = puVar19[1];
      *puVar19 = paVar26;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,&local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
      std::ios_base::~ios_base(local_318);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[13]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
    local_398._0_4_ = 0x19;
    pmVar23 = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pmVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
LAB_0013c778:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) goto LAB_0013c79c;
  }
  else {
    uVar30 = (long)local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    pcVar35 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    if (local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_0013cd68;
    uVar3 = (local_210.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    if ((local_210.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
LAB_0013cd50:
      uVar30 = uVar3;
      uVar33 = 0;
      pcVar35 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
      goto LAB_0013cd71;
    }
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    uVar32 = (int)paVar26->_M_local_buf[0] - 0x30;
    if (9 < uVar32) goto LAB_00138b2c;
    if (uVar30 < 2) {
LAB_0013cd5a:
      uVar33 = 1;
      goto LAB_0013cd71;
    }
    uVar3 = local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
    if (local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) goto LAB_0013cd50;
    if ((int)*local_210.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p - 0x30U < 10) {
      local_3d8 = var;
      local_3a0 = varName1;
      piVar17 = __errno_location();
      iVar15 = *piVar17;
      *piVar17 = 0;
      lVar16 = strtol(paVar26->_M_local_buf,(char **)local_398,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ == paVar26) {
        std::__throw_invalid_argument("stoi");
      }
      else if (((int)lVar16 == lVar16) && (*piVar17 != 0x22)) {
        if (*piVar17 == 0) {
          *piVar17 = iVar15;
        }
        local_3c8 = fn;
        if ((ulong)((long)local_210.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_210.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013cde5;
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        iVar15 = *piVar17;
        *piVar17 = 0;
        lVar18 = strtol(paVar26->_M_local_buf,(char **)local_398,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ == paVar26) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < lVar18 - 0x80000000U) && (*piVar17 != 0x22)) {
          if (*piVar17 == 0) {
            *piVar17 = iVar15;
          }
          iVar15 = Identifier::getDimension(local_3d8,2);
          uVar14 = iVar15 * (int)lVar16 + (int)lVar18;
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00139fa5;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00139fa5;
              }
              if (uVar25 < 10000) goto LAB_00139fa5;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_00139fa5:
          paVar26 = &local_458.field_2;
          local_458._M_dataplus._M_p = (pointer)paVar26;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_458,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_458._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_458,0,(char *)0x0,0x145946);
          psVar2 = local_3a0;
          psVar29 = (size_type *)(local_398 + 0x10);
          psVar28 = (size_type *)(plVar21 + 2);
          if ((size_type *)*plVar21 == psVar28) {
            local_388._M_allocated_capacity = *psVar28;
            local_388._8_8_ = plVar21[3];
            local_398._0_8_ = psVar29;
          }
          else {
            local_388._M_allocated_capacity = *psVar28;
            local_398._0_8_ = (size_type *)*plVar21;
          }
          local_398._8_8_ = plVar21[1];
          *plVar21 = (long)psVar28;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((size_type *)local_398._0_8_ != psVar29) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != paVar26) {
            operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[14]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
          if (local_3cc == LOCAL_VAR) {
            uVar14 = function::getOffSet(local_3c8,psVar2);
            uVar32 = -uVar14;
            if (0 < (int)uVar14) {
              uVar32 = uVar14;
            }
            uVar31 = 1;
            if (9 < uVar32) {
              uVar30 = (ulong)uVar32;
              uVar4 = 4;
              do {
                uVar31 = uVar4;
                uVar25 = (uint)uVar30;
                if (uVar25 < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_0013b414;
                }
                if (uVar25 < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_0013b414;
                }
                if (uVar25 < 10000) goto LAB_0013b414;
                uVar30 = uVar30 / 10000;
                uVar4 = uVar31 + 4;
              } while (99999 < uVar25);
              uVar31 = uVar31 + 1;
            }
LAB_0013b414:
            local_458._M_dataplus._M_p = (pointer)paVar26;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_458,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_458._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
            plVar21 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_458,0,(char *)0x0,0x14595c);
            psVar28 = (size_type *)(plVar21 + 2);
            if ((size_type *)*plVar21 == psVar28) {
              local_388._M_allocated_capacity = *psVar28;
              local_388._8_8_ = plVar21[3];
              local_398._0_8_ = psVar29;
            }
            else {
              local_388._M_allocated_capacity = *psVar28;
              local_398._0_8_ = (size_type *)*plVar21;
            }
            local_398._8_8_ = plVar21[1];
            *plVar21 = (long)psVar28;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398);
            if ((size_type *)local_398._0_8_ != psVar29) {
              operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != paVar26) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[16]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_398);
            pcVar1 = (psVar2->_M_dataplus)._M_p;
            local_458._M_dataplus._M_p = (pointer)paVar26;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_458,pcVar1,pcVar1 + psVar2->_M_string_length);
            _Var34._M_p = local_458._M_dataplus._M_p;
            if (local_458._M_string_length != 0) {
              sVar36 = 0;
              do {
                iVar15 = tolower((int)_Var34._M_p[sVar36]);
                _Var34._M_p[sVar36] = (char)iVar15;
                sVar36 = sVar36 + 1;
              } while (local_458._M_string_length != sVar36);
            }
            pmVar22 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::at(&var2mem_abi_cxx11_,&local_458);
            iVar15 = *pmVar22;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2)
            ;
            *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
                 *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
                 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15);
            std::__cxx11::stringbuf::str();
            plVar21 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_498,0,(char *)0x0,0x14595c);
            psVar29 = (size_type *)(plVar21 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar21 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar29) {
              local_3f8.field_2._M_allocated_capacity = *psVar29;
              local_3f8.field_2._8_8_ = plVar21[3];
              local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            }
            else {
              local_3f8.field_2._M_allocated_capacity = *psVar29;
              local_3f8._M_dataplus._M_p = (pointer)*plVar21;
            }
            local_3f8._M_string_length = plVar21[1];
            *plVar21 = (long)psVar29;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_3f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != paVar26) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
            std::ios_base::~ios_base(local_318);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
          local_398._0_4_ = 0x19;
          pmVar23 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar1 = (pmVar23->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
          goto LAB_0013c7a9;
        }
        std::__throw_out_of_range("stoi");
        goto LAB_0013ce10;
      }
      std::__throw_out_of_range("stoi");
LAB_0013cde5:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    if (9 < uVar32) {
LAB_00138b2c:
      if (uVar30 < 2) goto LAB_0013cd5a;
      if (local_210.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
        uVar33 = 0;
        pcVar35 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
        uVar30 = 0;
        goto LAB_0013cd71;
      }
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      if (9 < (int)paVar26->_M_local_buf[0] - 0x30U) goto LAB_00138cad;
      local_3d8 = var;
      local_3a0 = varName1;
      piVar17 = __errno_location();
      iVar15 = *piVar17;
      *piVar17 = 0;
      lVar16 = strtol(paVar26->_M_local_buf,(char **)local_398,10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ == paVar26) {
        std::__throw_invalid_argument("stoi");
      }
      else {
        iVar12 = (int)lVar16;
        if ((iVar12 == lVar16) && (*piVar17 != 0x22)) {
          if (*piVar17 == 0) {
            *piVar17 = iVar15;
          }
          if (local_210.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_210.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) goto LAB_0013cdbb;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          pcVar1 = ((local_210.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_458,pcVar1,
                     pcVar1 + (local_210.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          getRealName(&local_3f8,&local_458,'[');
          vVar8 = whatIsThisShit(&local_3f8,fn);
          if (vVar8 == TEMP_VAR) {
            bVar5 = function::varHasReg(fn,&local_458);
            if (bVar5) {
              RVar9 = function::getRegOfVar(fn,&local_458,true);
              local_418._M_dataplus._M_p._0_4_ = RVar9;
              pmVar23 = std::
                        map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(&reg2str_abi_cxx11_,(key_type *)&local_418);
              std::operator+(&local_438,"mul $t8 ",pmVar23);
              puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_438);
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar19 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 == paVar26) {
                local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_498.field_2._8_8_ = puVar19[3];
                local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
              }
              else {
                local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_498._M_dataplus._M_p = (pointer)*puVar19;
              }
              local_498._M_string_length = puVar19[1];
              *puVar19 = paVar26;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              iVar15 = Identifier::getDimension(local_3d8,2);
              std::__cxx11::to_string(&local_478,iVar15 << 2);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398,&local_498,&local_478);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_398 + 0x10)) {
                operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
                operator_delete(local_478._M_dataplus._M_p,
                                local_478.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              uVar33 = local_438.field_2._M_allocated_capacity;
              _Var34._M_p = local_438._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
LAB_0013a64e:
                operator_delete(_Var34._M_p,uVar33 + 1);
              }
            }
            else {
              iVar15 = function::getOffsetOfTemp(fn,&local_458,true);
              std::__cxx11::to_string(&local_438,iVar15);
              std::operator+(&local_498,"lw $t8 ",&local_438);
              puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_398 + 0x10);
              paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar19 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 == paVar27) {
                local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
                local_388._8_8_ = puVar19[3];
                local_398._0_8_ = paVar26;
              }
              else {
                local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
                local_398._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar19;
              }
              local_398._8_8_ = puVar19[1];
              *puVar19 = paVar27;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._0_8_ != paVar26) {
                operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p,
                                local_438.field_2._M_allocated_capacity + 1);
              }
              iVar15 = Identifier::getDimension(local_3d8,2);
              std::__cxx11::to_string(&local_498,iVar15 << 2);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398,"mul $t8 $t8 ",&local_498);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._0_8_ != paVar26) {
                operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
              }
              uVar33 = local_498.field_2._M_allocated_capacity;
              _Var34._M_p = local_498._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) goto LAB_0013a64e;
            }
          }
          else {
            getValueOfVar((string *)local_398,&local_458,fn);
            vVar8 = whatIsThisShit((string *)local_398,fn);
            if (vVar8 == TEMP_VAR) {
              std::operator+(&local_478,"mul $t8 ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398);
              puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_478);
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar19 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar19 == paVar26) {
                local_438.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_438.field_2._8_8_ = puVar19[3];
                local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
              }
              else {
                local_438.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
                local_438._M_dataplus._M_p = (pointer)*puVar19;
              }
              local_438._M_string_length = puVar19[1];
              *puVar19 = paVar26;
              puVar19[1] = 0;
              *(undefined1 *)(puVar19 + 2) = 0;
              iVar15 = Identifier::getDimension(local_3d8,2);
              std::__cxx11::to_string(&local_418,iVar15 << 2);
              std::operator+(&local_498,&local_438,&local_418);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,&local_498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                operator_delete(local_438._M_dataplus._M_p,
                                local_438.field_2._M_allocated_capacity + 1);
              }
              uVar33 = local_478.field_2._M_allocated_capacity;
              _Var34._M_p = local_478._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._M_dataplus._M_p != &local_478.field_2) {
LAB_0013a438:
                operator_delete(_Var34._M_p,uVar33 + 1);
              }
            }
            else {
              iVar15 = std::__cxx11::stoi((string *)local_398,(size_t *)0x0,10);
              iVar13 = Identifier::getDimension(local_3d8,2);
              std::__cxx11::to_string(&local_438,iVar15 * iVar13 * 4);
              std::operator+(&local_498,"li $t8 ",&local_438);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &mipsCode_abi_cxx11_,&local_498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._M_dataplus._M_p != &local_498.field_2) {
                operator_delete(local_498._M_dataplus._M_p,
                                local_498.field_2._M_allocated_capacity + 1);
              }
              uVar33 = local_438.field_2._M_allocated_capacity;
              _Var34._M_p = local_438._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) goto LAB_0013a438;
            }
            uVar33 = local_388._M_allocated_capacity;
            _Var34._M_p = (pointer)local_398._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_398 + 0x10)) goto LAB_0013a64e;
          }
          uVar14 = iVar12 * 4;
          uVar32 = iVar12 * -4;
          if (iVar12 * -4 < 0) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013a6b8;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013a6b8;
              }
              if (uVar25 < 10000) goto LAB_0013a6b8;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013a6b8:
          paVar26 = &local_498.field_2;
          local_498._M_dataplus._M_p = (pointer)paVar26;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_498,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_498._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,0x1459bd);
          psVar2 = local_3a0;
          psVar29 = (size_type *)(local_398 + 0x10);
          psVar28 = (size_type *)(plVar21 + 2);
          if ((size_type *)*plVar21 == psVar28) {
            local_388._M_allocated_capacity = *psVar28;
            local_388._8_8_ = plVar21[3];
            local_398._0_8_ = psVar29;
          }
          else {
            local_388._M_allocated_capacity = *psVar28;
            local_398._0_8_ = (size_type *)*plVar21;
          }
          local_398._8_8_ = plVar21[1];
          *plVar21 = (long)psVar28;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((size_type *)local_398._0_8_ != psVar29) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != paVar26) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if (local_3cc == LOCAL_VAR) {
            uVar14 = function::getOffSet(fn,psVar2);
            uVar32 = -uVar14;
            if (0 < (int)uVar14) {
              uVar32 = uVar14;
            }
            uVar31 = 1;
            if (9 < uVar32) {
              uVar30 = (ulong)uVar32;
              uVar4 = 4;
              do {
                uVar31 = uVar4;
                uVar25 = (uint)uVar30;
                if (uVar25 < 100) {
                  uVar31 = uVar31 - 2;
                  goto LAB_0013ab9b;
                }
                if (uVar25 < 1000) {
                  uVar31 = uVar31 - 1;
                  goto LAB_0013ab9b;
                }
                if (uVar25 < 10000) goto LAB_0013ab9b;
                uVar30 = uVar30 / 10000;
                uVar4 = uVar31 + 4;
              } while (99999 < uVar25);
              uVar31 = uVar31 + 1;
            }
LAB_0013ab9b:
            local_498._M_dataplus._M_p = (pointer)paVar26;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_498,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_498._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
            plVar21 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_498,0,(char *)0x0,0x14595c);
            psVar28 = (size_type *)(plVar21 + 2);
            if ((size_type *)*plVar21 == psVar28) {
              local_388._M_allocated_capacity = *psVar28;
              local_388._8_8_ = plVar21[3];
              local_398._0_8_ = psVar29;
            }
            else {
              local_388._M_allocated_capacity = *psVar28;
              local_398._0_8_ = (size_type *)*plVar21;
            }
            local_398._8_8_ = plVar21[1];
            *plVar21 = (long)psVar28;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398);
            if ((size_type *)local_398._0_8_ != psVar29) {
              operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != paVar26) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[16]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_398);
            pcVar1 = (psVar2->_M_dataplus)._M_p;
            local_498._M_dataplus._M_p = (pointer)paVar26;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_498,pcVar1,pcVar1 + psVar2->_M_string_length);
            sVar36 = local_498._M_string_length;
            _Var34._M_p = local_498._M_dataplus._M_p;
            if (local_498._M_string_length != 0) {
              sVar37 = 0;
              do {
                iVar15 = tolower((int)_Var34._M_p[sVar37]);
                _Var34._M_p[sVar37] = (char)iVar15;
                sVar37 = sVar37 + 1;
              } while (sVar36 != sVar37);
            }
            pmVar22 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::at(&var2mem_abi_cxx11_,&local_498);
            iVar15 = *pmVar22;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2)
            ;
            *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
                 *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
                 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15);
            std::__cxx11::stringbuf::str();
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x14595c);
            paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar19 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar19 == paVar27) {
              local_438.field_2._M_allocated_capacity = paVar27->_M_allocated_capacity;
              local_438.field_2._8_8_ = puVar19[3];
              local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            }
            else {
              local_438.field_2._M_allocated_capacity = paVar27->_M_allocated_capacity;
              local_438._M_dataplus._M_p = (pointer)*puVar19;
            }
            local_438._M_string_length = puVar19[1];
            *puVar19 = paVar27;
            puVar19[1] = 0;
            *(undefined1 *)(puVar19 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,&local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1
                             );
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[17]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != paVar26) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
            std::ios_base::~ios_base(local_318);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
          local_398._0_4_ = 0x19;
          pmVar23 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar1 = (pmVar23->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
          goto LAB_0013ace3;
        }
      }
      std::__throw_out_of_range("stoi");
LAB_0013cdbb:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    uVar3 = local_210.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
    if (local_210.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) goto LAB_0013cd50;
    if ((int)*local_210.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p - 0x30U < 10) {
      if (9 < uVar32) goto LAB_00138b2c;
LAB_00138cad:
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      pcVar1 = ((local_210.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,pcVar1,
                 pcVar1 + (local_210.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      if ((ulong)((long)local_210.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_210.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013cd90;
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      pcVar1 = local_210.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3f8,pcVar1,
                 pcVar1 + local_210.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      getRealName(&local_498,&local_458,'[');
      getRealName(&local_438,&local_3f8,'[');
      vVar10 = whatIsThisShit(&local_498,fn);
      vVar8 = whatIsThisShit(&local_438,fn);
      if (vVar10 == TEMP_VAR) {
        bVar5 = function::varHasReg(fn,&local_458);
        local_3d8 = (Identifier *)CONCAT44(local_3d8._4_4_,vVar8);
        if (bVar5) {
          RVar9 = function::getRegOfVar(fn,&local_458,true);
          local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1f8._4_4_,RVar9);
          pmVar23 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)&local_1f8);
          std::operator+(&local_418,"mul $t8 ",pmVar23);
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_418);
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478.field_2._8_8_ = puVar19[3];
          }
          else {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_478._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          uVar14 = Identifier::getDimension(var,2);
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013baed;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013baed;
              }
              if (uVar25 < 10000) goto LAB_0013baed;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013baed:
          paVar26 = &local_3c0.field_2;
          local_3c0._M_dataplus._M_p = (pointer)paVar26;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_3c0,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3c0._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          uVar33 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            uVar33 = local_478.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar33 < local_3c0._M_string_length + local_478._M_string_length) {
            uVar33 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != paVar26) {
              uVar33 = local_3c0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar33 < local_3c0._M_string_length + local_478._M_string_length)
            goto LAB_0013bb76;
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_478._M_dataplus._M_p);
          }
          else {
LAB_0013bb76:
            puVar19 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_478,(ulong)local_3c0._M_dataplus._M_p);
          }
          local_398._0_8_ = local_398 + 0x10;
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar27) {
            local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
            local_388._8_8_ = puVar19[3];
          }
          else {
            local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar19;
          }
          local_398._8_8_ = puVar19[1];
          *puVar19 = paVar27;
          puVar19[1] = 0;
          paVar27->_M_local_buf[0] = '\0';
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_398 + 0x10)) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != paVar26) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          vVar8 = (varType)local_3d8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          uVar33 = local_418.field_2._M_allocated_capacity;
          _Var34._M_p = local_418._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) goto LAB_0013bd6d;
        }
        else {
          uVar31 = 1;
          local_3c8 = fn;
          uVar14 = function::getOffsetOfTemp(fn,&local_458,true);
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013b65f;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013b65f;
              }
              if (uVar25 < 10000) goto LAB_0013b65f;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013b65f:
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_418,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_418._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x14599f);
          psVar29 = (size_type *)(plVar21 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar21 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar29) {
            local_478.field_2._M_allocated_capacity = *psVar29;
            local_478.field_2._8_8_ = plVar21[3];
            local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          }
          else {
            local_478.field_2._M_allocated_capacity = *psVar29;
            local_478._M_dataplus._M_p = (pointer)*plVar21;
          }
          local_478._M_string_length = plVar21[1];
          *plVar21 = (long)psVar29;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_478);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_398 + 0x10);
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar27) {
            local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
            local_388._8_8_ = puVar19[3];
            local_398._0_8_ = paVar26;
          }
          else {
            local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar19;
          }
          local_398._8_8_ = puVar19[1];
          *puVar19 = paVar27;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._0_8_ != paVar26) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          uVar14 = Identifier::getDimension(var,2);
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013bc83;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013bc83;
              }
              if (uVar25 < 10000) goto LAB_0013bc83;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013bc83:
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_478,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_478._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x1459b0);
          fn = local_3c8;
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          vVar8 = (varType)local_3d8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar27) {
            local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
            local_388._8_8_ = puVar19[3];
            local_398._0_8_ = paVar26;
          }
          else {
            local_388._M_allocated_capacity = paVar27->_M_allocated_capacity;
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar19;
          }
          local_398._8_8_ = puVar19[1];
          *puVar19 = paVar27;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._0_8_ != paVar26) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          uVar33 = local_478.field_2._M_allocated_capacity;
          _Var34._M_p = local_478._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) goto LAB_0013bd6d;
        }
      }
      else {
        getValueOfVar((string *)local_398,&local_458,fn);
        vVar10 = whatIsThisShit((string *)local_398,fn);
        uVar33 = local_398._0_8_;
        if (vVar10 == TEMP_VAR) {
          std::operator+(&local_3c0,"mul $t8 ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398);
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c0);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_418.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_418.field_2._8_8_ = puVar19[3];
          }
          else {
            local_418.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_418._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_418._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          uVar14 = Identifier::getDimension(var,2);
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013b934;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013b934;
              }
              if (uVar25 < 10000) goto LAB_0013b934;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013b934:
          local_1f8 = &local_1e8;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_1f8,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_1f8->_M_local_buf + (uVar14 >> 0x1f),uVar31,uVar32);
          uVar33 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            uVar33 = local_418.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar33 < local_1f0 + local_418._M_string_length) {
            uVar33 = 0xf;
            if (local_1f8 != &local_1e8) {
              uVar33 = local_1e8._M_allocated_capacity;
            }
            if ((ulong)uVar33 < local_1f0 + local_418._M_string_length) goto LAB_0013b9d3;
            puVar19 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_418._M_dataplus._M_p);
          }
          else {
LAB_0013b9d3:
            puVar19 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_1f8);
          }
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478.field_2._8_8_ = puVar19[3];
          }
          else {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_478._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          paVar26->_M_local_buf[0] = '\0';
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_478);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_3d8 = (Identifier *)CONCAT44(local_3d8._4_4_,vVar8);
          local_3a0 = varName1;
          piVar17 = __errno_location();
          local_3c8 = (function *)CONCAT44(local_3c8._4_4_,*piVar17);
          *piVar17 = 0;
          lVar16 = strtol((char *)uVar33,(char **)&local_3c0,10);
          if (local_3c0._M_dataplus._M_p == (pointer)uVar33) goto LAB_0013ce28;
          if (((int)lVar16 != lVar16) || (*piVar17 == 0x22)) goto LAB_0013ce34;
          if (*piVar17 == 0) {
            *piVar17 = (int)local_3c8;
          }
          iVar15 = Identifier::getDimension(var,2);
          uVar14 = iVar15 * (int)lVar16;
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          uVar31 = 1;
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013b83b;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013b83b;
              }
              if (uVar25 < 10000) goto LAB_0013b83b;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013b83b:
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_418,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_418._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x145946);
          varName1 = local_3a0;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478.field_2._8_8_ = puVar19[3];
            local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          }
          else {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_478._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_478);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          vVar8 = (varType)local_3d8;
        }
        uVar33 = local_388._M_allocated_capacity;
        _Var34._M_p = (pointer)local_398._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) goto LAB_0013bd75;
LAB_0013bd6d:
        operator_delete(_Var34._M_p,uVar33 + 1);
      }
LAB_0013bd75:
      if (vVar8 == TEMP_VAR) {
        bVar5 = function::varHasReg(fn,&local_3f8);
        if (bVar5) {
          RVar9 = function::getRegOfVar(fn,&local_3f8,true);
          local_478._M_dataplus._M_p._0_4_ = RVar9;
          pmVar23 = std::
                    map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::at(&reg2str_abi_cxx11_,(key_type *)&local_478);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398,"addu $t8 $t8 ",pmVar23);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_398 + 0x10)) goto LAB_0013c36c;
        }
        else {
          uVar31 = 1;
          uVar14 = function::getOffsetOfTemp(fn,&local_3f8,true);
          uVar32 = -uVar14;
          if (0 < (int)uVar14) {
            uVar32 = uVar14;
          }
          if (9 < uVar32) {
            uVar30 = (ulong)uVar32;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013c0c2;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013c0c2;
              }
              if (uVar25 < 10000) goto LAB_0013c0c2;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013c0c2:
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_418,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_418._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,0x1459d9);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478.field_2._8_8_ = puVar19[3];
            local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          }
          else {
            local_478.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_478._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_478._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_478);
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_388._8_8_ = puVar19[3];
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_398 + 0x10);
          }
          else {
            local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_398._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar19;
          }
          local_398._8_8_ = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_398 + 0x10)) {
            operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[17]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $t9");
        }
      }
      else {
        local_398._0_8_ = local_398 + 0x10;
        local_398._8_8_ = (char *)0x0;
        local_388._M_allocated_capacity = local_388._M_allocated_capacity & 0xffffffffffffff00;
        if (v1 == false) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"la $v1 ($t8)");
          std::__cxx11::string::_M_replace((ulong)local_398,0,(char *)local_398._8_8_,0x14585b);
          pbVar24 = &v1;
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"la $s7 ($t8)");
          std::__cxx11::string::_M_replace((ulong)local_398,0,(char *)local_398._8_8_,0x1458ab);
          pbVar24 = &s7;
        }
        *pbVar24 = true;
        getValueOfVar(&local_478,&local_3f8,fn);
        iVar15 = std::__cxx11::string::compare(local_398);
        if (iVar15 == 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($v1)");
          pbVar24 = &v1;
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[13]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,(char (*) [13])"la $t8 ($s7)");
          pbVar24 = &s7;
        }
        *pbVar24 = false;
        vVar8 = whatIsThisShit(&local_478,fn);
        _Var34._M_p = local_478._M_dataplus._M_p;
        if (vVar8 == TEMP_VAR) {
          std::operator+(&local_418,"addu $t8 $t8 ",&local_478);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_418);
          uVar33 = local_418.field_2._M_allocated_capacity;
          _Var34._M_p = local_418._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
LAB_0013c33c:
            operator_delete(_Var34._M_p,uVar33 + 1);
          }
        }
        else {
          local_3c8 = fn;
          piVar17 = __errno_location();
          iVar15 = *piVar17;
          *piVar17 = 0;
          lVar16 = strtol(_Var34._M_p,(char **)&local_1f8,10);
          if (local_1f8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var34._M_p) goto LAB_0013ce40;
          uVar32 = (uint)lVar16;
          if (((int)uVar32 != lVar16) || (*piVar17 == 0x22)) goto LAB_0013ce4c;
          if (*piVar17 == 0) {
            *piVar17 = iVar15;
          }
          uVar14 = -uVar32;
          if (0 < (int)uVar32) {
            uVar14 = uVar32;
          }
          uVar31 = 1;
          if (9 < uVar14) {
            uVar30 = (ulong)uVar14;
            uVar4 = 4;
            do {
              uVar31 = uVar4;
              uVar25 = (uint)uVar30;
              if (uVar25 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_0013c23f;
              }
              if (uVar25 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_0013c23f;
              }
              if (uVar25 < 10000) goto LAB_0013c23f;
              uVar30 = uVar30 / 10000;
              uVar4 = uVar31 + 4;
            } while (99999 < uVar25);
            uVar31 = uVar31 + 1;
          }
LAB_0013c23f:
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_3c0,(char)uVar31 - ((char)((ulong)lVar16 >> 0x18) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3c0._M_dataplus._M_p + (uVar32 >> 0x1f),uVar31,uVar14);
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x1459bd);
          fn = local_3c8;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar26) {
            local_418.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_418.field_2._8_8_ = puVar19[3];
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          }
          else {
            local_418.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
            local_418._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_418._M_string_length = puVar19[1];
          *puVar19 = paVar26;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mipsCode_abi_cxx11_,&local_418);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
          }
          uVar33 = local_3c0.field_2._M_allocated_capacity;
          _Var34._M_p = local_3c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) goto LAB_0013c33c;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) {
LAB_0013c36c:
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[14]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
      if (local_3cc == LOCAL_VAR) {
        uVar14 = function::getOffSet(fn,varName1);
        uVar32 = -uVar14;
        if (0 < (int)uVar14) {
          uVar32 = uVar14;
        }
        uVar31 = 1;
        if (9 < uVar32) {
          uVar30 = (ulong)uVar32;
          uVar4 = 4;
          do {
            uVar31 = uVar4;
            uVar25 = (uint)uVar30;
            if (uVar25 < 100) {
              uVar31 = uVar31 - 2;
              goto LAB_0013c5dc;
            }
            if (uVar25 < 1000) {
              uVar31 = uVar31 - 1;
              goto LAB_0013c5dc;
            }
            if (uVar25 < 10000) goto LAB_0013c5dc;
            uVar30 = uVar30 / 10000;
            uVar4 = uVar31 + 4;
          } while (99999 < uVar25);
          uVar31 = uVar31 + 1;
        }
LAB_0013c5dc:
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_478,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_478._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x14595c);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_388._8_8_ = puVar19[3];
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_398 + 0x10);
        }
        else {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar19;
        }
        local_398._8_8_ = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) {
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_398);
        pcVar1 = (varName1->_M_dataplus)._M_p;
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_478,pcVar1,pcVar1 + varName1->_M_string_length);
        sVar36 = local_478._M_string_length;
        _Var34._M_p = local_478._M_dataplus._M_p;
        if (local_478._M_string_length != 0) {
          sVar37 = 0;
          do {
            iVar15 = tolower((int)_Var34._M_p[sVar37]);
            _Var34._M_p[sVar37] = (char)iVar15;
            sVar37 = sVar37 + 1;
          } while (sVar36 != sVar37);
        }
        pmVar22 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(&var2mem_abi_cxx11_,&local_478);
        iVar15 = *pmVar22;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2);
        *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15);
        std::__cxx11::stringbuf::str();
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,0x14595c);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_418.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_418.field_2._8_8_ = puVar19[3];
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        }
        else {
          local_418.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_418._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_418._M_string_length = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
        std::ios_base::~ios_base(local_318);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[13]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
      local_398._0_4_ = 0x19;
      pmVar23 = std::
                map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (pmVar23->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0013c778;
    }
    local_3d8 = var;
    piVar17 = __errno_location();
    iVar15 = *piVar17;
    *piVar17 = 0;
    lVar16 = strtol(paVar26->_M_local_buf,(char **)local_398,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._0_8_ == paVar26) goto LAB_0013ce58;
    iVar12 = (int)lVar16;
    if ((iVar12 != lVar16) || (*piVar17 == 0x22)) goto LAB_0013ce64;
    if (*piVar17 == 0) {
      *piVar17 = iVar15;
    }
    if ((ulong)((long)local_210.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_210.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013ce70;
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    pcVar1 = local_210.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_458,pcVar1,
               pcVar1 + local_210.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    getRealName(&local_3f8,&local_458,'[');
    vVar8 = whatIsThisShit(&local_3f8,fn);
    if (vVar8 == TEMP_VAR) {
      bVar5 = function::varHasReg(fn,&local_458);
      if (bVar5) {
        RVar9 = function::getRegOfVar(fn,&local_458,true);
        local_438._M_dataplus._M_p._0_4_ = RVar9;
        pmVar23 = std::
                  map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(&reg2str_abi_cxx11_,(key_type *)&local_438);
        std::operator+(&local_498,"sll $t8 ",pmVar23);
        puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_388._8_8_ = puVar19[3];
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_398 + 0x10);
        }
        else {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar19;
        }
        local_398._8_8_ = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) {
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
        uVar33 = local_498.field_2._M_allocated_capacity;
        _Var34._M_p = local_498._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) goto LAB_0013c8d8;
      }
      else {
        iVar15 = function::getOffsetOfTemp(fn,&local_458,true);
        std::__cxx11::to_string(&local_438,iVar15);
        std::operator+(&local_498,"lw $t8 ",&local_438);
        puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_388._8_8_ = puVar19[3];
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_398 + 0x10);
        }
        else {
          local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_398._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar19;
        }
        local_398._8_8_ = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398 + 0x10)) {
          operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[14]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,(char (*) [14])"sll $t8 $t8 2");
      }
    }
    else {
      getValueOfVar((string *)local_398,&local_458,fn);
      vVar8 = whatIsThisShit((string *)local_398,fn);
      if (vVar8 == TEMP_VAR) {
        std::operator+(&local_438,"sll $t8 ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398);
        puVar19 = (undefined8 *)std::__cxx11::string::append((char *)&local_438);
        paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar26) {
          local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_498.field_2._8_8_ = puVar19[3];
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        }
        else {
          local_498.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
          local_498._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_498._M_string_length = puVar19[1];
        *puVar19 = paVar26;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
LAB_0013c826:
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar15 = std::__cxx11::stoi((string *)local_398,(size_t *)0x0,10);
        std::__cxx11::to_string(&local_438,iVar15 << 2);
        std::operator+(&local_498,"li $t8 ",&local_438);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mipsCode_abi_cxx11_,&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) goto LAB_0013c826;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      uVar33 = local_388._M_allocated_capacity;
      _Var34._M_p = (pointer)local_398._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_398 + 0x10)) {
LAB_0013c8d8:
        operator_delete(_Var34._M_p,uVar33 + 1);
      }
    }
    if (local_3cc == LOCAL_VAR) {
      iVar15 = function::getOffSet(fn,varName1);
      iVar13 = Identifier::getDimension(local_3d8,2);
      uVar14 = iVar15 + iVar13 * iVar12 * -4;
      uVar32 = -uVar14;
      if (0 < (int)uVar14) {
        uVar32 = uVar14;
      }
      uVar31 = 1;
      if (9 < uVar32) {
        uVar30 = (ulong)uVar32;
        uVar4 = 4;
        do {
          uVar31 = uVar4;
          uVar25 = (uint)uVar30;
          if (uVar25 < 100) {
            uVar31 = uVar31 - 2;
            goto LAB_0013cbfa;
          }
          if (uVar25 < 1000) {
            uVar31 = uVar31 - 1;
            goto LAB_0013cbfa;
          }
          if (uVar25 < 10000) goto LAB_0013cbfa;
          uVar30 = uVar30 / 10000;
          uVar4 = uVar31 + 4;
        } while (99999 < uVar25);
        uVar31 = uVar31 + 1;
      }
LAB_0013cbfa:
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_498,(char)uVar31 - (char)((int)uVar14 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_498._M_dataplus._M_p + (uVar14 >> 0x1f),uVar31,uVar32);
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,0x14595c);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 == paVar26) {
        local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_388._8_8_ = puVar19[3];
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_398 + 0x10);
      }
      else {
        local_388._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_398._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar19;
      }
      local_398._8_8_ = puVar19[1];
      *puVar19 = paVar26;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_398 + 0x10)) {
        operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [16])"sub $t8 $t9 $t8");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t8 $sp");
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_398);
      pcVar1 = (varName1->_M_dataplus)._M_p;
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_498,pcVar1,pcVar1 + varName1->_M_string_length);
      sVar36 = local_498._M_string_length;
      _Var34._M_p = local_498._M_dataplus._M_p;
      if (local_498._M_string_length != 0) {
        sVar37 = 0;
        do {
          iVar15 = tolower((int)_Var34._M_p[sVar37]);
          _Var34._M_p[sVar37] = (char)iVar15;
          sVar37 = sVar37 + 1;
        } while (sVar36 != sVar37);
      }
      pmVar22 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::at(&var2mem_abi_cxx11_,&local_498);
      iVar15 = *pmVar22;
      iVar13 = Identifier::getDimension(local_3d8,2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_398 + 0x10),"0x",2);
      *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_370 + *(long *)(local_388._M_allocated_capacity - 0x18)) &
           0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)(local_398 + 0x10),iVar15 + iVar13 * iVar12 * 4);
      std::__cxx11::stringbuf::str();
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x14595c);
      paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar19 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar19 == paVar26) {
        local_438.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_438.field_2._8_8_ = puVar19[3];
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      }
      else {
        local_438.field_2._M_allocated_capacity = paVar26->_M_allocated_capacity;
        local_438._M_dataplus._M_p = (pointer)*puVar19;
      }
      local_438._M_string_length = puVar19[1];
      *puVar19 = paVar26;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,&local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[17]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &mipsCode_abi_cxx11_,(char (*) [17])"addu $t8 $t9 $t8");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
      std::ios_base::~ios_base(local_318);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[13]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &mipsCode_abi_cxx11_,(char (*) [13])"lw $t9 ($t8)");
    local_398._0_4_ = 0x19;
    pmVar23 = std::
              map<Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Reg>,_std::allocator<std::pair<const_Reg,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&reg2str_abi_cxx11_,(key_type *)local_398);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pmVar23->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar23->_M_string_length);
LAB_0013ace3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p == &local_458.field_2) goto LAB_0013c7a9;
LAB_0013c79c:
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
LAB_0013c7a9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
LAB_0013c7b6:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string getValueOfVarIml(function &fn, string &varName, string &varName1, Identifier var, enum varType type) {
    stringstream stream;
    if (varName.find('[') == string::npos) {//普通标识符
        if (var.initialized && var.getIdCategory() == CONST) {//是否是初始化变量
            if (var.getTokenCategory() == CHARTK) {
                stream << var.getCharValue(0);
                return "\'" + stream.str() + "\'";
            } else {
                stream << var.getIntValue(0);
                return stream.str();
            }
        } else {
            string name = varName1;
            transform(name.begin(), name.end(), name.begin(), ::tolower);
            if (fn.varHasReg(varName1)) {//寄存器中存在
                return reg2str.at(fn.getRegOfVar(varName1, true));
            } else if (fn.stackHasVar(varName1) || var2mem.count(name) != 0) {//堆或栈中存在
                int offset;
                if (fn.stackHasVar(varName1)) {
                    offset = fn.getOffSet(varName1);
                    mipsCode.emplace_back("lw $t9 " + to_string(offset) + "($sp)");
                } else {
                    stringstream stream2;
                    string name0 = varName;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    offset = var2mem.at(name0);
                    stream2 << "0x" << hex << offset;
                    mipsCode.emplace_back("lw $t9 " + stream2.str());
                }
                return reg2str.at($t9);
            } else {//分配
                variableArrangeSpace(fn, varName1, whatIsThisShit(varName1, fn));
                if (fn.varHasReg(varName1))
                    return reg2str.at(fn.getRegOfVar(varName1, false));
                else {
                    mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffSet(varName1)) + "($sp)");
                    return reg2str.at($t9);
                }
            }
        }
    } else {
        vector<string> elements = boomVec(varName);
        if (elements.size() == 1) {//一维数组
            if (isdigit(elements.at(0).at(0))) {//数字下标
                int d1 = stoi(elements.at(0));
                mipsCode.emplace_back("li $t8 " + to_string(d1));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//变量下标
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else//变量转数字
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        } else {//二维数组
            if (isdigit(elements.at(0).at(0))
                && isdigit(elements.at(1).at(0))) {//两个都是数字下标
                int d1 = stoi(elements.at(0));
                int d2 = stoi(elements.at(1));
                int index = d1 * var.getDimension(2) + d2;
                mipsCode.emplace_back("li $t8 " + to_string(index));
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (isdigit(elements.at(0).at(0))
                       && !isdigit(elements.at(1).at(0))) {//第一维是数字下标，第二维不是
                int d1 = stoi(elements.at(0));
                string index = elements.at(1);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("sll $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " 2");
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("sll $t8 $t8 2");
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("sll $t8 " + vn + " 2");
                    else
                        mipsCode.emplace_back("li $t8 " + to_string(stoi(vn) * 4));
                }
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1) - d1 * var.getDimension(2) * 4;
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0) + d1 * var.getDimension(2) * 4;
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else if (!isdigit(elements.at(0).at(0))
                       && isdigit(elements.at(1).at(0))) {//第一维不是数字下标，第二维是
                int d2 = stoi(elements.at(1)) * 4;
                string index = elements.at(0);
                string realName = getRealName(index, '[');
                if (whatIsThisShit(realName, fn) == TEMP_VAR) {
                    if (fn.varHasReg(index))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index, true)) + " " +
                                              to_string(var.getDimension(2) * 4));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2) * 4));
                    }
                } else {
                    string vn = getValueOfVar(index, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2) * 4));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2) * 4));
                }
                mipsCode.emplace_back("addi $t8 $t8 " + to_string(d2));
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            } else {//第一维和第二维都不是数字下标
                string index1 = elements.at(0);
                string index2 = elements.at(1);
                string realName1 = getRealName(index1, '[');
                string realName2 = getRealName(index2, '[');
                varType ty1 = whatIsThisShit(realName1, fn);
                varType ty2 = whatIsThisShit(realName2, fn);
                if (ty1 == TEMP_VAR) {
                    if (fn.varHasReg(index1))
                        mipsCode.emplace_back("mul $t8 " +
                                              reg2str.at(fn.getRegOfVar(index1, true)) + " " +
                                              to_string(var.getDimension(2)));
                    else {
                        mipsCode.emplace_back("lw $t8 " + to_string(fn.getOffsetOfTemp(index1, true)) + "($sp)");
                        mipsCode.emplace_back("mul $t8 $t8 " + to_string(var.getDimension(2)));
                    }
                } else {
                    string vn = getValueOfVar(index1, fn);
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("mul $t8 " + vn + " " +
                                              to_string(var.getDimension(2)));
                    else
                        mipsCode.emplace_back(
                                "li $t8 " + to_string(stoi(vn) * var.getDimension(2)));
                }
                if (ty2 == TEMP_VAR) {
                    if (fn.varHasReg(index2))
                        mipsCode.emplace_back("addu $t8 $t8 " + reg2str.at(fn.getRegOfVar(index2, true)));
                    else {
                        mipsCode.emplace_back("lw $t9 " + to_string(fn.getOffsetOfTemp(index2, true)) + "($sp)");
                        mipsCode.emplace_back("addu $t8 $t8 $t9");
                    }
                } else {
                    string choose;
                    if (!v1) {
                        mipsCode.emplace_back("la $v1 ($t8)");
                        choose = "v1";
                        v1 = true;
                    } else {
                        mipsCode.emplace_back("la $s7 ($t8)");
                        choose = "s7";
                        s7 = true;
                    }
                    string vn = getValueOfVar(index2, fn);
                    if (choose == "v1") {
                        mipsCode.emplace_back("la $t8 ($v1)");
                        v1 = false;
                    } else {
                        mipsCode.emplace_back("la $t8 ($s7)");
                        s7 = false;
                    }
                    if (whatIsThisShit(vn, fn) == TEMP_VAR)//$t9
                        mipsCode.emplace_back("addu $t8 $t8 " + vn);
                    else
                        mipsCode.emplace_back("addi $t8 $t8 " + to_string(stoi(vn)));
                }
                mipsCode.emplace_back("sll $t8 $t8 2");
                if (type == LOCAL_VAR) {//局部数组变量存于栈中
                    int base = fn.getOffSet(varName1);
                    mipsCode.emplace_back("li $t9 " + to_string(base));
                    mipsCode.emplace_back("sub $t8 $t9 $t8");
                    mipsCode.emplace_back("addu $t8 $t8 $sp");
                } else {//全局数组变量存于堆中
                    stringstream stream2;
                    string name0 = varName1;
                    transform(name0.begin(), name0.end(), name0.begin(), ::tolower);
                    int base = var2mem.at(name0);
                    stream2 << "0x" << hex << base;
                    mipsCode.emplace_back("li $t9 " + stream2.str());
                    mipsCode.emplace_back("addu $t8 $t9 $t8");
                }
                mipsCode.emplace_back("lw $t9 ($t8)");
                return reg2str.at($t9);
            }
        }
    }
}